

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall ImgfsFile::markent(ImgfsFile *this,uint64_t ofs,entrytype_t tag)

{
  uint uVar1;
  reference pvVar2;
  uint ix;
  entrytype_t tag_local;
  uint64_t ofs_local;
  ImgfsFile *this_local;
  
  uVar1 = entryofs2index(this,ofs);
  if (tag != FREEENTRY) {
    pvVar2 = std::vector<ImgfsFile::entrytype_t,_std::allocator<ImgfsFile::entrytype_t>_>::
             operator[](&this->_entrymap,(ulong)uVar1);
    if (*pvVar2 != FREEENTRY) {
      pvVar2 = std::vector<ImgfsFile::entrytype_t,_std::allocator<ImgfsFile::entrytype_t>_>::
               operator[](&this->_entrymap,(ulong)uVar1);
      printf("entry %08llx (%d) is already %c, marking %c\n",ofs,(ulong)uVar1,
             (ulong)(uint)(int)(char)*pvVar2,(ulong)(uint)(int)(char)tag);
    }
  }
  pvVar2 = std::vector<ImgfsFile::entrytype_t,_std::allocator<ImgfsFile::entrytype_t>_>::operator[]
                     (&this->_entrymap,(ulong)uVar1);
  *pvVar2 = tag;
  return;
}

Assistant:

void markent(uint64_t ofs, entrytype_t tag)
    {
        unsigned ix= entryofs2index(ofs);
        if (tag!=FREEENTRY && _entrymap[ix]!=FREEENTRY) {
            printf("entry %08llx (%d) is already %c, marking %c\n", ofs, ix, _entrymap[ix], tag);
        }
        _entrymap[ix]= tag;
    }